

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

uint128_wrapper *
fmt::v7::detail::dragonbox::cache_accessor<double>::get_cached_power
          (uint128_wrapper *__return_storage_ptr__,int k)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint128_wrapper *puVar9;
  int iVar10;
  
  iVar5 = (int)__return_storage_ptr__;
  iVar8 = iVar5 + 0x124;
  iVar4 = (iVar8 / 0x1b) * 0x1b + -0x124;
  lVar7 = (long)(iVar8 / 0x1b) * 0x10;
  puVar9 = *(uint128_wrapper **)(basic_data<void>::dragonbox_pow10_significands_128 + lVar7);
  iVar10 = iVar5 - iVar4;
  if (iVar10 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(basic_data<void>::powers_of_5_64 + (long)iVar10 * 8);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)puVar9 - (ulong)(iVar5 < 5);
    bVar3 = (char)((uint)(iVar5 * 0x1a934f) >> 0x13) -
            ((char)((uint)(iVar4 * 0x1a934f) >> 0x13) + (char)iVar10) & 0x3f;
    uVar6 = SUB168(auVar1 * auVar2,0) >> bVar3 |
            SUB168(auVar1 * auVar2,8) +
            *(long *)(basic_data<void>::dragonbox_pow10_significands_128 + lVar7 + 8) *
            *(ulong *)(basic_data<void>::powers_of_5_64 + (long)iVar10 * 8) << 0x40 - bVar3;
    if (iVar5 < 5) {
      uVar6 = uVar6 + 1;
    }
    iVar5 = iVar5 + 0x133;
    if (-1 < iVar8) {
      iVar5 = iVar8;
    }
    puVar9 = (uint128_wrapper *)
             ((*(uint *)(basic_data<void>::dragonbox_pow10_recovery_errors + (long)(iVar5 >> 4) * 4)
               >> (((char)iVar8 - ((byte)iVar5 & 0xf0)) * '\x02' & 0x1f) & 3) + uVar6);
  }
  return puVar9;
}

Assistant:

static uint128_wrapper get_cached_power(int k) FMT_NOEXCEPT {
    FMT_ASSERT(k >= float_info<double>::min_k && k <= float_info<double>::max_k,
               "k is out of range");

#if FMT_USE_FULL_CACHE_DRAGONBOX
    return data::dragonbox_pow10_significands_128[k -
                                                  float_info<double>::min_k];
#else
    static const int compression_ratio = 27;

    // Compute base index.
    int cache_index = (k - float_info<double>::min_k) / compression_ratio;
    int kb = cache_index * compression_ratio + float_info<double>::min_k;
    int offset = k - kb;

    // Get base cache.
    uint128_wrapper base_cache =
        data::dragonbox_pow10_significands_128[cache_index];
    if (offset == 0) return base_cache;

    // Compute the required amount of bit-shift.
    int alpha = floor_log2_pow10(kb + offset) - floor_log2_pow10(kb) - offset;
    FMT_ASSERT(alpha > 0 && alpha < 64, "shifting error detected");

    // Try to recover the real cache.
    uint64_t pow5 = data::powers_of_5_64[offset];
    uint128_wrapper recovered_cache = umul128(base_cache.high(), pow5);
    uint128_wrapper middle_low =
        umul128(base_cache.low() - (kb < 0 ? 1u : 0u), pow5);

    recovered_cache += middle_low.high();

    uint64_t high_to_middle = recovered_cache.high() << (64 - alpha);
    uint64_t middle_to_low = recovered_cache.low() << (64 - alpha);

    recovered_cache =
        uint128_wrapper{(recovered_cache.low() >> alpha) | high_to_middle,
                        ((middle_low.low() >> alpha) | middle_to_low)};

    if (kb < 0) recovered_cache += 1;

    // Get error.
    int error_idx = (k - float_info<double>::min_k) / 16;
    uint32_t error = (data::dragonbox_pow10_recovery_errors[error_idx] >>
                      ((k - float_info<double>::min_k) % 16) * 2) &
                     0x3;

    // Add the error back.
    FMT_ASSERT(recovered_cache.low() + error >= recovered_cache.low(), "");
    return {recovered_cache.high(), recovered_cache.low() + error};
#endif
  }